

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

void pybind11::detail::translate_exception(exception_ptr *p)

{
  undefined8 uVar1;
  error_already_set *this;
  long *plVar2;
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [12];
  exception_ptr local_20;
  
  if (p->_M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_20,p);
    auVar5 = std::rethrow_exception((exception_ptr)&local_20);
    iVar4 = auVar5._8_4_;
    uVar1 = auVar5._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
    if (iVar4 == 0xb) {
      this = (error_already_set *)__cxa_begin_catch(uVar1);
      error_already_set::restore(this);
    }
    else if (iVar4 == 10) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      (**(code **)(*plVar2 + 0x18))(plVar2);
    }
    else if (iVar4 == 9) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_MemoryError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else if (iVar4 == 8) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_ValueError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else if (iVar4 == 7) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_ValueError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else if (iVar4 == 6) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_ValueError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else if (iVar4 == 5) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_IndexError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else if (iVar4 == 4) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_ValueError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else if (iVar4 == 3) {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_OverflowError;
      uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      PyErr_SetString(uVar1,uVar3);
    }
    else {
      plVar2 = (long *)__cxa_begin_catch(uVar1);
      uVar1 = _PyExc_RuntimeError;
      if (iVar4 == 2) {
        uVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
        PyErr_SetString(uVar1,uVar3);
      }
      else {
        PyErr_SetString(_PyExc_RuntimeError,"Caught an unknown exception!");
      }
    }
    __cxa_end_catch();
  }
  return;
}

Assistant:

inline void translate_exception(std::exception_ptr p) {
    try {
        if (p) std::rethrow_exception(p);
    } catch (error_already_set &e)           { e.restore();                                    return;
    } catch (const builtin_exception &e)     { e.set_error();                                  return;
    } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
    } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
    } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
    } catch (const std::overflow_error &e)   { PyErr_SetString(PyExc_OverflowError, e.what()); return;
    } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
    } catch (...) {
        PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
        return;
    }
}